

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void render_stuff(ImageBuffer *buffer,SDL_Window *window,int max_samples,int max_seconds,
                 _Bool uniform_sampling)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  long lVar4;
  Camera camera;
  ImageBuffer *buffer_00;
  SDL_Window *pSVar5;
  _Bool _Var6;
  uint uVar7;
  code *pcVar8;
  size_t n;
  long lVar9;
  undefined7 in_register_00000081;
  ulong uVar10;
  int iVar11;
  Vec3 pos;
  Vec3 origin;
  Vec3 origin_00;
  Vec3 origin_01;
  _Bool local_5da;
  byte local_5d9;
  uint local_5d8;
  uint local_5d4;
  uint local_5d0;
  int local_5cc;
  Sampler *local_5c8;
  ImageBuffer *local_5c0;
  ulong local_5b8;
  ulong local_5b0;
  ulong local_5a8;
  SDL_Window *local_5a0;
  Color yellow;
  Color green;
  Color red;
  undefined8 local_568;
  undefined4 local_560;
  Color white;
  Material mirror_mat;
  Material emissive_mat;
  Material yellow_mat;
  Material green_mat;
  Material red_mat;
  Material white_mat;
  TriangleMesh suzanne;
  BSDF lambert;
  Light l;
  Camera cam;
  Scene local_458;
  BSDF mirror;
  BSDF emissive;
  undefined1 local_3f8 [80];
  Material *local_3a8;
  undefined4 local_3a0;
  Triangle *local_398;
  size_t sStack_390;
  BVHNode *local_388;
  Material *local_350;
  undefined4 local_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  Material *local_2f8;
  undefined4 local_2f0;
  PartialPlane local_2e8;
  Material *local_2a0;
  undefined4 local_298;
  PartialPlane local_290;
  Material *local_248;
  undefined4 local_240;
  PartialPlane local_238;
  Material *local_1f0;
  undefined4 local_1e8;
  PartialPlane local_1e0;
  Material *local_198;
  undefined4 local_190;
  PartialPlane local_188;
  Material *local_140;
  char total_time [256];
  
  white.r = 1.0;
  white.g = 1.0;
  white.b = 1.0;
  local_568 = 0x4290000042a00000;
  local_560 = 0x42800000;
  red.b = 0.0;
  red.r = 1.0;
  red.g = 0.0;
  green.b = 0.0;
  green.r = 0.0;
  green.g = 1.0;
  yellow.b = 0.0;
  yellow.r = 1.0;
  yellow.g = 1.0;
  lambert.emitted = (BSDFEmission)0x0;
  lambert.f = lambert_bsdf;
  if ((int)CONCAT71(in_register_00000081,uniform_sampling) == 0) {
    pcVar8 = cosine_weighted_bsdf_sampler;
  }
  else {
    pcVar8 = uniform_bsdf_sampler;
  }
  yellow_mat.bsdf = &lambert;
  white_mat.params = &white;
  red_mat.params = &red;
  green_mat.params = &green;
  yellow_mat.params = &yellow;
  emissive_mat.bsdf = &emissive;
  emissive.sampler = (BSDFSampler)0x0;
  emissive.emitted = isotropic_emission;
  emissive.f = (BSDFTransmission)0x0;
  emissive_mat.params = &local_568;
  mirror_mat.bsdf = &mirror;
  mirror.sampler = perfect_reflection_sampler;
  mirror.emitted = (BSDFEmission)0x0;
  mirror.f = perfect_reflection_bsdf;
  mirror_mat.params = (void *)0x0;
  l.color.g = 1.0;
  l.color.b = 0.5;
  l.intensity = 3.0;
  l.position.x = 0.0;
  l.position.y = 1.0;
  l.position.z = 2.0;
  l.color.r = 0.3;
  uVar1 = buffer->width;
  uVar2 = buffer->height;
  cam.kind = PERSPECTIVE;
  pos.z = 3.0;
  pos.x = -7.5;
  pos.y = 0.0;
  local_5d8 = max_samples;
  local_5d4 = max_seconds;
  local_5a0 = window;
  green_mat.bsdf = yellow_mat.bsdf;
  red_mat.bsdf = yellow_mat.bsdf;
  white_mat.bsdf = yellow_mat.bsdf;
  lambert.sampler = pcVar8;
  create_perspective_camera
            (&cam.camera.perspective,pos,(Vec3)(ZEXT412(0x40400000) << 0x40),
             (float)(int)uVar1 / (float)(int)uVar2,90.0);
  _Var6 = read_obj_file(&suzanne,"res/suzanne.obj");
  if (_Var6) {
    local_3f8._0_4_ = 1;
    create_partial_plane
              ((PartialPlane *)(local_3f8 + 8),(Vec3)(ZEXT412(0x40be6666) << 0x40),
               (Vec3)ZEXT812(0x3f800000),(Vec3)ZEXT812(0x3f80000000000000),-1.0,-1.0,1.0,1.0);
    local_3a8 = &emissive_mat;
    local_3a0 = 4;
    local_398 = suzanne.triangles;
    sStack_390 = suzanne.triangle_count;
    local_388 = suzanne.bvh_root;
    local_350 = &yellow_mat;
    local_348 = 2;
    local_330 = 0;
    uStack_328 = 0;
    local_320 = 0;
    uStack_318 = 0;
    local_310 = 0;
    uStack_308 = 0;
    local_300 = 0;
    local_340 = 0x3fc000003f99999a;
    uStack_338 = 0x3f8ccccd3f8ccccd;
    local_2f8 = &mirror_mat;
    local_2f0 = 1;
    origin.z = 3.0;
    origin.x = 0.0;
    origin.y = -3.0;
    create_partial_plane
              (&local_2e8,origin,(Vec3)ZEXT812(0x3f800000),(Vec3)(ZEXT412(0x3f800000) << 0x40),-3.0,
               -3.0,3.0,3.0);
    local_2a0 = &green_mat;
    local_298 = 1;
    origin_00.z = 3.0;
    origin_00.x = 3.0;
    origin_00.y = 0.0;
    create_partial_plane
              (&local_290,origin_00,(Vec3)ZEXT812(0x3f80000000000000),
               (Vec3)(ZEXT412(0x3f800000) << 0x40),-3.0,-3.0,3.0,3.0);
    local_240 = 1;
    origin_01.z = 3.0;
    origin_01.x = 0.0;
    origin_01.y = 3.0;
    local_248 = &white_mat;
    create_partial_plane
              (&local_238,origin_01,(Vec3)ZEXT812(0x3f800000),(Vec3)(ZEXT412(0x3f800000) << 0x40),
               -3.0,-3.0,3.0,3.0);
    local_1f0 = &red_mat;
    local_1e8 = 1;
    create_partial_plane
              (&local_1e0,(Vec3)ZEXT812(0),(Vec3)ZEXT812(0x3f800000),
               (Vec3)ZEXT812(0x3f80000000000000),-3.0,-3.0,3.0,3.0);
    local_190 = 1;
    local_198 = &white_mat;
    create_partial_plane
              (&local_188,(Vec3)(ZEXT412(0x40c00000) << 0x40),(Vec3)ZEXT812(0x3f800000),
               (Vec3)ZEXT812(0x3f80000000000000),-3.0,-3.0,3.0,3.0);
    local_458.objects = (Object *)local_3f8;
    local_458.light_count = 1;
    local_458.lights = &l;
    local_458.object_count = 8;
    local_140 = &white_mat;
    clear_buffer(buffer);
    local_5da = false;
    uVar7 = SDL_GetTicks();
    local_5a8 = (ulong)uVar7;
    local_5d0 = get_nprocs();
    printf("Detected %1$d cores, rendering with %1$d threads.\n",(ulong)local_5d0);
    n = (long)buffer->height * (long)buffer->width;
    local_5c8 = (Sampler *)malloc(n * 0x68);
    create_samplers(local_5c8,n);
    local_5b0 = (ulong)local_5d8;
    local_5b8 = (ulong)local_5d4;
    uVar10 = 1;
    local_5c0 = buffer;
    do {
      buffer_00 = local_5c0;
      bVar3 = 0 < (int)local_5d4;
      local_5d9 = (int)local_5d8 < 1;
      local_5cc = SDL_GetTicks();
      handle_events(&local_5da);
      camera.camera.perspective.eye.x = cam.camera.perspective.eye.x;
      camera.kind = cam.kind;
      camera.camera._4_8_ = cam.camera._4_8_;
      camera.camera._12_8_ = cam.camera._12_8_;
      camera.camera._20_8_ = cam.camera._20_8_;
      camera.camera._28_8_ = cam.camera._28_8_;
      camera.camera._36_8_ = cam.camera._36_8_;
      camera.camera.perspective.basis[2].z = (float)(int)cam.camera._44_8_;
      camera.camera.perspective.xscale = (float)(int)((ulong)cam.camera._44_8_ >> 0x20);
      camera.camera.perspective.yscale = (float)(int)cam.camera._52_8_;
      camera.camera.perspective.depth = (float)(int)((ulong)cam.camera._52_8_ >> 0x20);
      sample_scene_master(&local_458,camera,buffer_00,local_5c8,local_5d0);
      pSVar5 = local_5a0;
      render_buffer(local_5a0,buffer_00,2.2);
      SDL_UpdateWindowSurface(pSVar5);
      uVar7 = SDL_GetTicks();
      lVar9 = uVar7 - local_5a8;
      lVar4 = lVar9 / 1000;
      iVar11 = (int)lVar4;
      sprintf(total_time,"%02dh %02dm %02ds",(ulong)(uint)(iVar11 / 0xe10),
              (ulong)(uint)((iVar11 / 0x3c) % 0x3c),(ulong)(uint)(iVar11 % 0x3c));
      printf("%6ld samples | last %4ldms | average %4ldms | total %s\r",uVar10,
             (ulong)uVar7 - (long)local_5cc,lVar9 / (long)uVar10,total_time);
      fflush(_stdout);
      if (((uVar10 < local_5b0 | local_5d9) != 1) || (bVar3 && (long)local_5b8 <= lVar4)) break;
      uVar10 = uVar10 + 1;
    } while ((local_5da & 1U) == 0);
    free(local_5c8);
  }
  return;
}

Assistant:

void render_stuff(ImageBuffer* buffer,
                  SDL_Window* window,
                  int max_samples,
                  int max_seconds,
                  bool uniform_sampling) {
    Color white = {1.0f, 1.0f, 1.0f};
    Color cream = cscale((Color){1.0f, .9f, .8f}, 80.0f);
    Color red = {1.0f, .0f, .0f};
    Color green = {0.0f, 1.0f, .0f};
    Color yellow = {1.0f, 1.0f, .0f};

    BSDF lambert = {
        .f = lambert_bsdf,
        .sampler = uniform_sampling ? uniform_bsdf_sampler : cosine_weighted_bsdf_sampler,
        .emitted = NULL
    };
    Material white_mat = {
        .bsdf = &lambert,
        .params = &white
    };
    Material red_mat = {
        .bsdf = &lambert,
        .params = &red
    };
    Material green_mat = {
        .bsdf = &lambert,
        .params = &green
    };
    Material yellow_mat = {
        .bsdf = &lambert,
        .params = &yellow
    };

    BSDF emissive = {
        .f = NULL,
        .sampler = NULL,
        .emitted = isotropic_emission
    };
    Material emissive_mat = {
        .bsdf = &emissive,
        .params = &cream
    };

    BSDF mirror = {
        .f = perfect_reflection_bsdf,
        .sampler = perfect_reflection_sampler,
        .emitted = NULL
    };
    Material mirror_mat = {
        .bsdf = &mirror,
        .params = NULL
    };
    
    Light l = {
        .position = {.0f, 1.0f, 2.0f},
        .color = {.3f, 1.0f, .5f},
        .intensity = 3.0f,
    };
    
    float ratio = (float) buffer->width / buffer->height;
    float fov = 90.0f;
    Camera cam = {
        .kind = PERSPECTIVE,
        .camera = {
            .perspective = create_perspective_camera(
                (Vec3) {-7.5f, 0.0f, 3.0f},
                (Vec3) {0.0f, 0.0f, 3.0f},
                ratio,
                fov)
        }
    };

    TriangleMesh suzanne;
    if (!read_obj_file(&suzanne, "res/suzanne.obj"))
        return;

    Scene sc = {
        .objects = (Object[]) {
            // light
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 5.95f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -1, -1,
                        1, 1
                        )
                },
                .material = &emissive_mat,
            },
            /* { */
            /* 	.kind = GEO_SPHERE, */
            /* 	.geometry = { */
            /* 	    .sphere = { */
            /* 		.center = {1.3f, -.5f, 1.5f}, */
            /* 		.radius = 1.5f, */
            /* 	    } */
            /* 	}, */
            /* 	.material = &yellow_mat */
            /* }, */
            {
                .kind = GEO_TRIANGLE_MESH,
                .geometry = {
                    .triangle_mesh = suzanne
                },
                .material = &yellow_mat
            },
            {
                .kind = GEO_SPHERE,
                .geometry = {
                    .sphere = {
                        .center = {1.2f, 1.5f, 1.1f},
                        .radius = 1.1f,
                    }
                },
                .material = &mirror_mat
            },
            // WALLS
            // right
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, -3.0f, 3.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &green_mat,
            },
            // back
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {3.0f, 0.0f, 3.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &white_mat
            },
            // left
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 3.0f, 3.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 0.0f, 1.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &red_mat
            },
            // floor
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 0.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -3, -3,
                        3, 3
                        )
                },
		
                .material = &white_mat
            },
            // ceiling
            {
                .kind = GEO_PARTIAL_PLANE,
                .geometry = {
                    .partial_plane = create_partial_plane(
                        (Vec3) {0.0f, 0.0f, 6.0f},
                        (Vec3) {1.0f, 0.0f, 0.0f},
                        (Vec3) {0.0f, 1.0f, 0.0f},
                        -3, -3,
                        3, 3
                        )
                },
                .material = &white_mat
            }
        },
        .light_count = 1,
        .lights = &l,
    };
    sc.object_count = sizeof(sc.objects);
    
    clear_buffer(buffer);
    bool quit = false;
    long int samples = 0;
    long int t0 = SDL_GetTicks();
    int n_cores = get_nprocs();
    printf("Detected %1$d cores, rendering with %1$d threads.\n", n_cores);
    Sampler* samplers = malloc(sizeof(Sampler) * buffer->width * buffer->height);
    create_samplers(samplers, buffer->width * buffer->height);
    while (!quit) {
        int t = SDL_GetTicks();

        handle_events(&quit);
		
        //sample_scene(&sc, cam, buffer);
        sample_scene_master(&sc, cam, buffer, samplers, n_cores); 
	
        render_buffer(window, buffer, GAMMA);
        SDL_UpdateWindowSurface(window);

        ++samples;
        long int now = SDL_GetTicks();
        char total_time[256];
        long int total_seconds = (now - t0) / 1000;
        format_time(total_seconds, total_time);
        printf("%6ld samples | last %4ldms | average %4ldms | total %s\r",
               samples,
               now - t,
               (now - t0) / samples,
               total_time);
        fflush(stdout);

        if ((max_samples > 0 && samples >= max_samples) ||
            (max_seconds > 0 && total_seconds >= max_seconds)) {
            quit = true;
        }
    }
    free(samplers);
}